

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldblib.c
# Opt level: O1

int db_debug(lua_State *L)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  size_t size;
  char buffer [250];
  int local_138;
  short local_134;
  
  pvVar2 = ravi_get_debugger_data(L);
  if (pvVar2 == (void *)0x0) {
    ravi_writestringerror(L,"%s","lua_debug> ");
    pcVar3 = fgets((char *)&local_138,0xfa,_stdin);
    while ((pcVar3 != (char *)0x0 && (local_134 != 10 || local_138 != 0x746e6f63))) {
      size = strlen((char *)&local_138);
      iVar1 = luaL_loadbufferx(L,(char *)&local_138,size,"=(debug command)",(char *)0x0);
      if ((iVar1 != 0) || (iVar1 = lua_pcallk(L,0,0,0,0,(lua_KFunction)0x0), iVar1 != 0)) {
        pcVar3 = lua_tolstring(L,-1,(size_t *)0x0);
        ravi_writestringerror(L,"%s\n",pcVar3);
      }
      lua_settop(L,0);
      ravi_writestringerror(L,"%s","lua_debug> ");
      pcVar3 = fgets((char *)&local_138,0xfa,_stdin);
    }
  }
  return 0;
}

Assistant:

static int db_debug (lua_State *L) {
  /* Ravi change - disallow when debugging via VSCode */
  if (ravi_get_debugger_data(L) != NULL)
    return 0;
  for (;;) {
    char buffer[250];
    lua_writestringerror("%s", "lua_debug> ");
    if (fgets(buffer, sizeof(buffer), stdin) == 0 ||
        strcmp(buffer, "cont\n") == 0)
      return 0;
    if (luaL_loadbuffer(L, buffer, strlen(buffer), "=(debug command)") ||
        lua_pcall(L, 0, 0, 0))
      lua_writestringerror("%s\n", lua_tostring(L, -1));
    lua_settop(L, 0);  /* remove eventual returns */
  }
}